

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O2

ostream * spvtools::utils::operator<<(ostream *out,BitVector *bv)

{
  pointer puVar1;
  ostream *poVar2;
  uint uVar3;
  unsigned_long uVar4;
  
  std::operator<<(out,"{");
  uVar3 = 0;
  while( true ) {
    puVar1 = (bv->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(bv->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= (ulong)uVar3
       ) break;
    for (uVar4 = puVar1[uVar3]; uVar4 != 0; uVar4 = uVar4 >> 1) {
      if ((uVar4 & 1) != 0) {
        poVar2 = std::operator<<(out,' ');
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      }
    }
    uVar3 = uVar3 + 1;
  }
  std::operator<<(out,"}");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const BitVector& bv) {
  out << "{";
  for (uint32_t i = 0; i < bv.bits_.size(); ++i) {
    BitVector::BitContainer b = bv.bits_[i];
    uint32_t j = 0;
    while (b != 0) {
      if (b & 1) {
        out << ' ' << i * BitVector::kBitContainerSize + j;
      }
      ++j;
      b = b >> 1;
    }
  }
  out << "}";
  return out;
}